

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O2

bool duckdb::IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
               (IntegerDecimalCastData<int> *state)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  result_t tmp;
  
  uVar4 = state->result;
  tmp = (result_t)uVar4;
  if ((long)tmp == uVar4) {
    uVar2 = state->decimal;
    iVar3 = *(int *)&state->decimal_digits;
    while( true ) {
      iVar3 = iVar3 + -1;
      if ((long)uVar2 < 0xb) break;
      uVar2 = uVar2 / 10;
      state->decimal = uVar2;
      state->decimal_digits = (uint16_t)iVar3;
    }
    bVar1 = true;
    if (4 < (long)uVar2 && (uint16_t)iVar3 == 0) {
      bVar1 = TryAddOperator::Operation<int,int,int>(tmp,1,&tmp);
      uVar4 = (ulong)(uint)tmp;
    }
    state->result = (long)(int)uVar4;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		using store_t = typename T::StoreType;

		result_t tmp;
		if (!TryCast::Operation<store_t, result_t>(state.result, tmp)) {
			return false;
		}

		while (state.decimal > 10) {
			state.decimal /= 10;
			state.decimal_digits--;
		}

		bool success = true;
		if (state.decimal_digits == 1 && state.decimal >= 5) {
			if (NEGATIVE) {
				success = TrySubtractOperator::Operation(tmp, (result_t)1, tmp);
			} else {
				success = TryAddOperator::Operation(tmp, (result_t)1, tmp);
			}
		}
		state.result = tmp;
		return success;
	}